

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O2

bool __thiscall bssl::tls_append_handshake_data(bssl *this,SSL *ssl,Span<const_unsigned_char> data)

{
  long lVar1;
  int iVar2;
  BUF_MEM *__p;
  BUF_MEM *buf;
  
  lVar1 = *(long *)(this + 0x30);
  buf = *(BUF_MEM **)(lVar1 + 0xe0);
  if (buf == (BUF_MEM *)0x0) {
    __p = BUF_MEM_new();
    std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)(lVar1 + 0xe0),(pointer)__p);
    buf = *(BUF_MEM **)(*(long *)(this + 0x30) + 0xe0);
    if (buf == (BUF_MEM *)0x0) {
      return false;
    }
  }
  iVar2 = BUF_MEM_append(buf,ssl,(size_t)data.data_);
  return iVar2 != 0;
}

Assistant:

bool tls_append_handshake_data(SSL *ssl, Span<const uint8_t> data) {
  // Re-create the handshake buffer if needed.
  if (!ssl->s3->hs_buf) {
    ssl->s3->hs_buf.reset(BUF_MEM_new());
  }
  return ssl->s3->hs_buf &&
         BUF_MEM_append(ssl->s3->hs_buf.get(), data.data(), data.size());
}